

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

void __thiscall
Compiler::processFunction
          (Compiler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *line,bool destroyReturnValue)

{
  bool bVar1;
  const_reference pvVar2;
  size_type sVar3;
  char *pcVar4;
  reference pvVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  Variable local_138;
  Variable local_108;
  uint local_d8;
  uint local_d4;
  uint a;
  uint sizeAfterEvaluation;
  uint local_ac;
  uint local_a8;
  uint sizeBeforeEvaluation;
  uint exitPointPos;
  allocator local_79;
  string local_78 [35];
  undefined1 local_55;
  char local_48 [32];
  Scope *local_28;
  Scope *scope;
  DataType possibleType;
  bool destroyReturnValue_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *line_local;
  Compiler *this_local;
  
  scope._7_1_ = destroyReturnValue;
  _possibleType = line;
  line_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](line,0);
  scope._0_4_ = stringToDataType(pvVar2);
  if (((DataType)scope != UNKNOWN) &&
     (sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(_possibleType), 2 < sVar3)) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](_possibleType,2);
    pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)pvVar2);
    if (*pcVar4 == '(') {
      Scope::reset(&this->expectedScopeType);
      (this->expectedScopeType).type = FUNCTION;
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](_possibleType,1);
      std::__cxx11::string::operator=
                ((string *)&(this->expectedScopeType).identifier,(string *)pvVar2);
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](_possibleType,2);
      std::__cxx11::string::operator=
                ((string *)&(this->expectedScopeType).incrementor,(string *)pvVar2);
      (this->expectedScopeType).returnType = (DataType)scope;
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](_possibleType,1);
      bVar1 = std::operator==(pvVar2,"entry");
      if (!bVar1) {
        return;
      }
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->bytecode);
      pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (&this->bytecode,1);
      *pvVar5 = (value_type)sVar3;
      return;
    }
  }
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](_possibleType,0);
  local_28 = getPastScope(this,pvVar2);
  if (local_28 != (Scope *)0x0) {
    if (local_28->returnType != VOID) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,"",&local_79);
      InstructionGenerator::genCreateDefaultValue
                (&this->igen,(string *)local_78,local_28->returnType);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&exitPointPos,"functionEnd",(allocator *)((long)&sizeBeforeEvaluation + 3))
    ;
    InstructionGenerator::genCreateInt(&this->igen,(string *)&exitPointPos,0);
    std::__cxx11::string::~string((string *)&exitPointPos);
    std::allocator<char>::~allocator((allocator<char> *)((long)&sizeBeforeEvaluation + 3));
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->bytecode);
    local_a8 = (int)sVar3 - 1;
    local_ac = VirtualStack::getStackSize(&(this->igen).super_VirtualStack);
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](_possibleType,1);
    std::__cxx11::string::string((string *)&a,(string *)pvVar2);
    evaluateBracket(this,(string *)&a);
    std::__cxx11::string::~string((string *)&a);
    local_d4 = VirtualStack::getStackSize(&(this->igen).super_VirtualStack);
    for (local_d8 = local_ac; local_d8 < local_d4; local_d8 = local_d8 + 1) {
      VirtualStack::pop(&local_108,&(this->igen).super_VirtualStack);
      Variable::~Variable(&local_108);
    }
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(&this->bytecode);
    pvVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&this->bytecode,(ulong)local_a8);
    *pvVar5 = (int)sVar3 + 2;
    InstructionGenerator::genGoto(&this->igen,local_28->startPos);
    VirtualStack::pop(&local_138,&(this->igen).super_VirtualStack);
    Variable::~Variable(&local_138);
    if ((local_28->returnType != VOID) && ((scope._7_1_ & 1) != 0)) {
      InstructionGenerator::genStackWalk(&this->igen,1);
    }
    return;
  }
  local_55 = 1;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          __cxa_allocate_exception(0x20);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator[](_possibleType,0);
  std::operator+(local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          "Failed to find entry point for \'");
  std::operator+(__lhs,local_48);
  local_55 = 0;
  __cxa_throw(__lhs,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void Compiler::processFunction(const std::vector<std::string>& line, bool destroyReturnValue)
{
    DataType possibleType = stringToDataType(line[0]);
    if(possibleType != DataType::UNKNOWN && line.size() > 2 && line[2][0] == '(') //If we're defining a function
    {
        //Reset the expected scope
        expectedScopeType.reset();

        //Add the function
        expectedScopeType.type = Scope::FUNCTION; //Store the scope type
        expectedScopeType.identifier = line[1]; //Store the function name
        expectedScopeType.incrementor = line[2]; //Store the function arguments
        expectedScopeType.returnType = possibleType; //Store the return value type

        //If this is the program entry point, update the entry point goto position
        if(line[1] == "entry")
            bytecode[1] = bytecode.size();
    }
    else //Else if we're calling a function
    {
        Scope *scope = getPastScope(line[0]);
        if(scope == nullptr)
            throw std::string("Failed to find entry point for '" + line[0] + "'");

        //Reserve space for return value if needed
        if(scope->returnType != DataType::VOID)
            igen.genCreateDefaultValue("", scope->returnType);

        //Create the exit point
        igen.genCreateInt("functionEnd", 0); //Add a bit for the stack walk below
        unsigned int exitPointPos = bytecode.size()-1;

        //Evaluate arguments, adding to the stack
        unsigned int sizeBeforeEvaluation = igen.getStackSize();
        evaluateBracket(line[1]);
        unsigned int sizeAfterEvaluation = igen.getStackSize();

        //Artificially remove them from the compiler's stack, as the values are already cleaned up by the function scope end
        for(unsigned int a = sizeBeforeEvaluation; a < sizeAfterEvaluation; a++)
            igen.pop();

        //update the exit point position
        bytecode[exitPointPos] = bytecode.size()+2;

        //Goto the function
        igen.genGoto(scope->startPos);

        //Remove exit point, it will have been used by the function
        igen.pop();

        //Remove return value if specified
        if(scope->returnType != DataType::VOID && destroyReturnValue)
        {
            igen.genStackWalk(1);
        }
    }
}